

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void accum_3d(float32 ***out,float32 ***in,uint32 d1,uint32 d2,uint32 d3)

{
  uint local_30;
  uint local_2c;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 d3_local;
  uint32 d2_local;
  uint32 d1_local;
  float32 ***in_local;
  float32 ***out_local;
  
  for (k = 0; k < d1; k = k + 1) {
    for (local_2c = 0; local_2c < d2; local_2c = local_2c + 1) {
      for (local_30 = 0; local_30 < d3; local_30 = local_30 + 1) {
        out[k][local_2c][local_30] =
             (float32)((float)in[k][local_2c][local_30] + (float)out[k][local_2c][local_30]);
      }
    }
  }
  return;
}

Assistant:

void
accum_3d(float32 ***out,
	 float32 ***in,
	 uint32 d1,
	 uint32 d2,
	 uint32 d3)
{
    uint32 i, j, k;

    for (i = 0; i < d1; i++) {
	for (j = 0; j < d2; j++) {
	    for (k = 0; k < d3; k++) {
		out[i][j][k] += in[i][j][k];
	    }
	}
    }
}